

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLenum gl4cts::EnhancedLayouts::Utils::Buffer::GetUsageGLenum(USAGE usage)

{
  TestError *this;
  GLenum local_10;
  GLenum result;
  USAGE usage_local;
  
  switch(usage) {
  case DynamicCopy:
    local_10 = 0x88ea;
    break;
  case DynamicDraw:
    local_10 = 0x88e8;
    break;
  case DynamicRead:
    local_10 = 0x88e9;
    break;
  case StaticCopy:
    local_10 = 0x88e6;
    break;
  case StaticDraw:
    local_10 = 0x88e4;
    break;
  case StaticRead:
    local_10 = 0x88e5;
    break;
  case StreamCopy:
    local_10 = 0x88e2;
    break;
  case StreamDraw:
    local_10 = 0x88e0;
    break;
  case StreamRead:
    local_10 = 0x88e1;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x7d7);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_10;
}

Assistant:

GLenum Buffer::GetUsageGLenum(USAGE usage)
{
	GLenum result = 0;

	switch (usage)
	{
	case DynamicCopy:
		result = GL_DYNAMIC_COPY;
		break;
	case DynamicDraw:
		result = GL_DYNAMIC_DRAW;
		break;
	case DynamicRead:
		result = GL_DYNAMIC_READ;
		break;
	case StaticCopy:
		result = GL_STATIC_COPY;
		break;
	case StaticDraw:
		result = GL_STATIC_DRAW;
		break;
	case StaticRead:
		result = GL_STATIC_READ;
		break;
	case StreamCopy:
		result = GL_STREAM_COPY;
		break;
	case StreamDraw:
		result = GL_STREAM_DRAW;
		break;
	case StreamRead:
		result = GL_STREAM_READ;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}